

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

bool mathiu::impl::
     lessC<std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::Product,mathiu::impl::Product>
               (Product *v1,Product *v2)

{
  bool bVar1;
  reference ppVar2;
  reference ppVar3;
  size_type sVar4;
  size_type sVar5;
  bool local_41;
  undefined1 local_40 [8];
  undefined1 local_38 [16];
  const_reverse_iterator j;
  const_reverse_iterator i;
  Product *v2_local;
  Product *v1_local;
  
  std::rbegin<mathiu::impl::Product>((Product *)&j);
  std::rbegin<mathiu::impl::Product>((Product *)(local_38 + 8));
  while( true ) {
    std::rend<mathiu::impl::Product>((Product *)local_38);
    bVar1 = std::operator!=(&j,(reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                                *)local_38);
    local_41 = false;
    if (bVar1) {
      std::rend<mathiu::impl::Product>((Product *)local_40);
      local_41 = std::operator!=((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                                  *)(local_38 + 8),
                                 (reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                                  *)local_40);
    }
    if (local_41 == false) break;
    ppVar2 = std::
             reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
             ::operator*(&j);
    ppVar3 = std::
             reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
             ::operator*((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                          *)(local_38 + 8));
    bVar1 = equal(ppVar2,ppVar3);
    if (!bVar1) {
      ppVar2 = std::
               reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
               ::operator*(&j);
      ppVar3 = std::
               reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
               ::operator*((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                            *)(local_38 + 8));
      bVar1 = less(ppVar2,ppVar3);
      return bVar1;
    }
    std::
    reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::operator++(&j);
    std::
    reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::operator++((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  *)(local_38 + 8));
  }
  sVar4 = std::
          map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
          ::size(&v1->super_ExprPtrMap);
  sVar5 = std::
          map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
          ::size(&v2->super_ExprPtrMap);
  return sVar4 < sVar5;
}

Assistant:

bool lessC(C1 const &v1, C2 const &v2)
    {
        auto i = std::rbegin(v1);
        auto j = std::rbegin(v2);
        for (; i != std::rend(v1) && j != std::rend(v2); ++i, ++j)
        {
            if (equal((*i), (*j)))
            {
                continue;
            }
            else
            {
                return less((*i), (*j));
            }
        }
        return v1.size() < v2.size();
    }